

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::clear(Graph *this)

{
  pointer pLVar1;
  pointer __s;
  pointer pCVar2;
  pointer pEVar3;
  Edge *e;
  pointer pEVar4;
  
  pLVar1 = (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar1) {
    (this->bridges).super__Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar1;
  }
  __s = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
        super__Vector_impl_data._M_start;
  pCVar2 = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__s != pCVar2) {
    memset(__s,0,((long)pCVar2 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
  }
  pEVar3 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar3; pEVar4 = pEVar4 + 1) {
    pEVar4->finished = false;
  }
  return;
}

Assistant:

void Graph::clear() {
    bridges.clear();
    for (auto &c : colorMap)
        c = Colors::White;
    for (auto &e : edges)
        e.finished = false;
}